

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O3

Error asmjit::v1_14::JitAllocatorImpl_shrink
                (JitAllocatorPrivateImpl *impl,Span *span,size_t newSize,bool alreadyUnderWriteScope
                )

{
  BitWord *pBVar1;
  ushort uVar2;
  JitAllocatorBlock *this;
  JitAllocatorPool *pJVar3;
  long lVar4;
  sbyte sVar5;
  uint32_t shrunkAreaEnd;
  BitWord *pBVar6;
  uint uVar7;
  uint uVar8;
  BitWord BVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  void *mem;
  Error local_58;
  
  this = (JitAllocatorBlock *)span->_block;
  if (this == (JitAllocatorBlock *)0x0) {
    local_58 = 2;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&impl->lock);
    pJVar3 = this->_pool;
    uVar12 = (ulong)((long)span->_rx - (long)(this->_mapping).rx) >>
             (pJVar3->granularityLog2 & 0x3f);
    uVar11 = (uint)uVar12;
    uVar12 = uVar12 >> 6 & 0x3ffffff;
    local_58 = 2;
    if ((this->_usedBitVector[uVar12] >> (uVar11 & 0x3f) & 1) != 0) {
      pBVar6 = this->_stopBitVector + uVar12;
      sVar5 = (sbyte)(uVar11 & 0x3f);
      BVar9 = (*pBVar6 >> sVar5) << sVar5;
      while (BVar9 == 0) {
        pBVar1 = pBVar6 + 1;
        pBVar6 = pBVar6 + 1;
        BVar9 = *pBVar1;
      }
      lVar4 = 0;
      if (BVar9 != 0) {
        for (; (BVar9 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      shrunkAreaEnd = (int)lVar4 + ((int)pBVar6 - (int)this->_stopBitVector) * 8 + 1;
      uVar10 = shrunkAreaEnd - uVar11;
      uVar2 = pJVar3->granularity;
      uVar7 = (uint)uVar2;
      uVar12 = (newSize + uVar2) - 1 >> (pJVar3->granularityLog2 & 0x3f);
      uVar8 = (uint)uVar12;
      if (uVar8 <= uVar10) {
        if (uVar10 - uVar8 != 0) {
          JitAllocatorBlock::markShrunkArea(this,uVar11 + uVar8,shrunkAreaEnd);
          uVar2 = pJVar3->granularity;
          span->_size = (uVar12 & 0xffffffff) * (ulong)uVar2;
        }
        if ((newSize < uVar7 * uVar10) &&
           (((impl->super_Impl).options & kFillUnusedMemory) != kNone)) {
          mem = (void *)((ulong)((uVar11 + uVar8) * (uint)uVar2) + (long)(this->_mapping).rw);
          uVar12 = (ulong)((uVar10 - uVar8) * (uint)uVar2);
          if (alreadyUnderWriteScope) {
            local_58 = 0;
            JitAllocatorImpl_fillPattern(mem,(impl->super_Impl).fillPattern,uVar12);
          }
          else {
            local_58 = 0;
            VirtMem::protectJitMemory(kReadWrite);
            JitAllocatorImpl_fillPattern(mem,(impl->super_Impl).fillPattern,uVar12);
            VirtMem::protectJitMemory(kReadExecute);
          }
        }
        else {
          local_58 = 0;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&impl->lock);
  }
  return local_58;
}

Assistant:

static Error JitAllocatorImpl_shrink(JitAllocatorPrivateImpl* impl, JitAllocator::Span& span, size_t newSize, bool alreadyUnderWriteScope) noexcept {
  JitAllocatorBlock* block = static_cast<JitAllocatorBlock*>(span._block);
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorInvalidArgument);

  LockGuard guard(impl->lock);

  // Offset relative to the start of the block.
  JitAllocatorPool* pool = block->pool();
  size_t offset = (size_t)((uint8_t*)span.rx() - block->rxPtr());

  // The first bit representing the allocated area and its size.
  uint32_t areaStart = uint32_t(offset >> pool->granularityLog2);

  // Don't trust `span.size()` - if it has been already truncated we would be off...
  bool isUsed = Support::bitVectorGetBit(block->_usedBitVector, areaStart);
  if (ASMJIT_UNLIKELY(!isUsed))
    return DebugUtils::errored(kErrorInvalidArgument);

  uint32_t areaEnd = uint32_t(Support::bitVectorIndexOf(block->_stopBitVector, areaStart, true)) + 1;
  uint32_t areaPrevSize = areaEnd - areaStart;
  uint32_t spanPrevSize = areaPrevSize * pool->granularity;
  uint32_t areaShrunkSize = pool->areaSizeFromByteSize(newSize);

  if (ASMJIT_UNLIKELY(areaShrunkSize > areaPrevSize))
    return DebugUtils::errored(kErrorInvalidArgument);

  uint32_t areaDiff = areaPrevSize - areaShrunkSize;
  if (areaDiff) {
    block->markShrunkArea(areaStart + areaShrunkSize, areaEnd);
    span._size = pool->byteSizeFromAreaSize(areaShrunkSize);
  }

  // Fill released memory if the secure mode is enabled.
  if (newSize < spanPrevSize && Support::test(impl->options, JitAllocatorOptions::kFillUnusedMemory)) {
    uint8_t* spanPtr = block->rwPtr() + (areaStart + areaShrunkSize) * pool->granularity;
    size_t spanSize = areaDiff * pool->granularity;

    if (!alreadyUnderWriteScope) {
      VirtMem::ProtectJitReadWriteScope scope(spanPtr, spanSize, VirtMem::CachePolicy::kNeverFlush);
      JitAllocatorImpl_fillPattern(spanPtr, impl->fillPattern, spanSize);
    }
    else {
      JitAllocatorImpl_fillPattern(spanPtr, impl->fillPattern, spanSize);
    }
  }

  return kErrorOk;
}